

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

char * conc(vector<char> *buf,tagval *v,int n,bool space,char *prefix,int prefixlen)

{
  size_t sVar1;
  undefined7 in_register_00000009;
  uint n_00;
  long lVar2;
  string *__s;
  char local_3f [3];
  undefined4 local_3c;
  stringformatter local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000009,space);
  if ((prefix != (char *)0x0) &&
     (vector<char>::put(buf,prefix,prefixlen), (char)local_3c == '\x01' && n != 0)) {
    local_3f[2] = 0x20;
    vector<char>::add(buf,local_3f + 2);
  }
  if (0 < n) {
    lVar2 = 0;
    do {
      __s = (string *)0x16d6b4;
      switch(*(undefined4 *)((long)&v->type + lVar2)) {
      case 1:
        retidx = retidx + ((retidx + 1U) / 3) * -3 + 1;
        local_38.buf = retbuf[(uint)retidx];
        stringformatter::operator()
                  (&local_38,"%d",(ulong)*(uint *)((long)&(v->super_identval).field_0 + lVar2));
        __s = retbuf + (uint)retidx;
        break;
      case 2:
        __s = (string *)floatstr(*(float *)((long)&(v->super_identval).field_0 + lVar2));
        break;
      case 3:
        __s = *(string **)((long)&(v->super_identval).field_0 + lVar2);
        break;
      case 6:
        __s = *(string **)((long)&(v->super_identval).field_0 + lVar2);
        n_00 = *(uint *)(__s[-1] + 0x100) >> 8;
        goto LAB_00127f2d;
      }
      sVar1 = strlen(*__s);
      n_00 = (uint)sVar1;
LAB_00127f2d:
      vector<char>::put(buf,*__s,n_00);
      if ((ulong)(n - 1) << 4 == lVar2) break;
      if ((char)local_3c != '\0') {
        local_3f[0] = ' ';
        vector<char>::add(buf,local_3f);
      }
      lVar2 = lVar2 + 0x10;
    } while( true );
  }
  local_3f[1] = 0;
  vector<char>::add(buf,local_3f + 1);
  return buf->buf;
}

Assistant:

static char *conc(vector<char> &buf, tagval *v, int n, bool space, const char *prefix = NULL, int prefixlen = 0)
{
    if(prefix)
    {
        buf.put(prefix, prefixlen);
        if(space && n) buf.add(' ');
    }
    loopi(n)
    {
        const char *s = "";
        int len = 0;
        switch(v[i].type)
        {
            case VAL_INT: s = intstr(v[i].i); break;
            case VAL_FLOAT: s = floatstr(v[i].f); break;
            case VAL_STR: s = v[i].s; break;
            case VAL_MACRO: s = v[i].s; len = v[i].code[-1]>>8; goto haslen;
        }
        len = int(strlen(s));
    haslen:
        buf.put(s, len);
        if(i == n-1) break;
        if(space) buf.add(' ');
    }
    buf.add('\0');
    return buf.getbuf();
}